

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O2

void ncnn::conv3x3s1_winograd43_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Option *opt)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  uint _c;
  uint _c_00;
  int iVar8;
  undefined8 uVar9;
  int j;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint _h;
  int iVar13;
  int iVar14;
  ulong uVar15;
  void *pvVar16;
  uint _w;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  void *pvVar21;
  int i_1;
  int iVar22;
  ulong uVar23;
  void *pvVar24;
  void *pvVar25;
  int q;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  short t5 [6];
  short t4 [6];
  short t3 [6];
  short t2 [6];
  short t1 [6];
  short t0 [6];
  short local_3ec [10];
  short w5 [6];
  short w4 [6];
  short d2 [6];
  short w3 [6];
  short w2 [6];
  short w1 [6];
  short w0 [6];
  int local_2c0;
  Mat top_blob_tm;
  short d3 [6];
  size_t local_268;
  int local_24c;
  Mat top_blob_bordered;
  int d5_1 [4];
  int d4_1 [4];
  Mat bottom_blob_tm;
  short d4 [6];
  short d5 [6];
  Mat bottom_blob_bordered;
  int o3 [4];
  int o2 [4];
  int o1 [4];
  int o0 [4];
  Option opt_b;
  
  _c = bottom_blob->c;
  iVar18 = top_blob->w;
  iVar10 = top_blob->h;
  _c_00 = top_blob->c;
  Mat::Mat(&bottom_blob_bordered,bottom_blob);
  iVar8 = (iVar18 + 3) / 4;
  _w = iVar8 * 4;
  uVar23 = (long)(iVar10 + 3) / 4;
  iVar18 = (int)uVar23;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b._34_6_ = *(undefined6 *)&opt->field_0x22;
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.blob_allocator = opt->workspace_allocator;
  uVar27 = (long)(int)_w | 2;
  copy_make_border(bottom_blob,&bottom_blob_bordered,0,(iVar18 * 4 + 2) - bottom_blob->h,0,
                   (_w | 2) - bottom_blob->w,0,0.0,&opt_b);
  bottom_blob_tm.elemsize._0_4_ = 0;
  bottom_blob_tm.elemsize._4_4_ = 0;
  bottom_blob_tm.elempack = 0;
  bottom_blob_tm.data = (void *)0x0;
  bottom_blob_tm.refcount._0_4_ = 0;
  bottom_blob_tm.refcount._4_4_ = 0;
  bottom_blob_tm.allocator = (Allocator *)0x0;
  bottom_blob_tm.dims = 0;
  bottom_blob_tm.w = 0;
  bottom_blob_tm.h = 0;
  bottom_blob_tm.c = 0;
  bottom_blob_tm.cstep = 0;
  _h = iVar18 * iVar8;
  Mat::create(&bottom_blob_tm,0x24,_h,_c,2,opt->workspace_allocator);
  uVar15 = 0;
  iVar10 = 0;
  if (0 < iVar8) {
    iVar10 = iVar8;
  }
  uVar23 = uVar23 & 0xffffffff;
  if (iVar18 < 1) {
    uVar23 = uVar15;
  }
  uVar30 = (ulong)_c;
  if ((int)_c < 1) {
    uVar30 = uVar15;
  }
  for (; uVar15 != uVar30; uVar15 = uVar15 + 1) {
    pvVar16 = (void *)(bottom_blob_bordered.cstep * uVar15 * bottom_blob_bordered.elemsize +
                      (long)bottom_blob_bordered.data);
    top_blob_bordered.refcount._0_4_ = 0;
    top_blob_bordered.refcount._4_4_ = 0;
    top_blob_bordered.elemsize._0_4_ = (undefined4)bottom_blob_bordered.elemsize;
    top_blob_bordered.elemsize._4_4_ = (undefined4)(bottom_blob_bordered.elemsize >> 0x20);
    top_blob_bordered.elempack = bottom_blob_bordered.elempack;
    top_blob_bordered.allocator = bottom_blob_bordered.allocator;
    top_blob_bordered.w = bottom_blob_bordered.w;
    top_blob_bordered.dims = 2;
    top_blob_bordered.c = 1;
    top_blob_bordered.h = bottom_blob_bordered.h;
    top_blob_bordered.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
    top_blob_bordered.data = pvVar16;
    Mat::~Mat(&top_blob_bordered);
    pvVar24 = (void *)(bottom_blob_tm.cstep * uVar15 *
                       CONCAT44(bottom_blob_tm.elemsize._4_4_,(undefined4)bottom_blob_tm.elemsize) +
                      (long)bottom_blob_tm.data);
    top_blob_bordered.refcount._0_4_ = 0;
    top_blob_bordered.refcount._4_4_ = 0;
    top_blob_bordered.elemsize._0_4_ = (undefined4)bottom_blob_tm.elemsize;
    top_blob_bordered.elemsize._4_4_ = bottom_blob_tm.elemsize._4_4_;
    top_blob_bordered.elempack = bottom_blob_tm.elempack;
    top_blob_bordered.allocator = bottom_blob_tm.allocator;
    top_blob_bordered.w = bottom_blob_tm.w;
    top_blob_bordered.dims = 2;
    top_blob_bordered.c = 1;
    top_blob_bordered.h = bottom_blob_tm.h;
    top_blob_bordered.cstep = (size_t)(bottom_blob_tm.h * bottom_blob_tm.w);
    top_blob_bordered.data = pvVar24;
    Mat::~Mat(&top_blob_bordered);
    for (uVar11 = 0; uVar11 != uVar23; uVar11 = uVar11 + 1) {
      lVar12 = (long)((int)uVar27 * 4 * (int)uVar11) + (long)pvVar16;
      for (iVar13 = 0; iVar13 != iVar10; iVar13 = iVar13 + 1) {
        for (lVar17 = 0; lVar17 != 6; lVar17 = lVar17 + 1) {
          *(short *)((long)&top_blob_bordered.data + lVar17 * 2) = (short)*(char *)(lVar12 + lVar17)
          ;
          lVar19 = lVar12 + lVar17 + uVar27;
          d3[lVar17 + -0x20] = (short)*(char *)(uVar27 + lVar12 + lVar17);
          lVar20 = lVar19 + uVar27;
          d2[lVar17] = (short)*(char *)(uVar27 + lVar19);
          lVar19 = lVar20 + uVar27;
          d3[lVar17] = (short)*(char *)(uVar27 + lVar20);
          d4[lVar17] = (short)*(char *)(uVar27 + lVar19);
          d5[lVar17] = (short)*(char *)(lVar19 + uVar27 * 2);
        }
        for (lVar17 = 0; lVar17 != 0xc; lVar17 = lVar17 + 2) {
          sVar4 = *(short *)((long)d2 + lVar17);
          sVar5 = *(short *)((long)d4 + lVar17);
          *(short *)((long)w0 + lVar17) =
               sVar4 * -5 + *(short *)((long)&top_blob_bordered.data + lVar17) * 4 + sVar5;
          sVar6 = *(short *)((long)d3 + lVar17 + -0x40);
          sVar7 = *(short *)((long)d3 + lVar17);
          *(short *)((long)w1 + lVar17) = sVar5 + (sVar4 + sVar6) * -4 + sVar7;
          *(short *)((long)w2 + lVar17) = (sVar5 - sVar7) + (sVar6 - sVar4) * 4;
          *(short *)((long)w3 + lVar17) = (sVar5 - (sVar4 + sVar6 * 2)) + sVar7 * 2;
          *(short *)((long)w4 + lVar17) = (sVar5 + sVar6 * 2) - (sVar4 + sVar7 * 2);
          *(short *)((long)w5 + lVar17) = sVar7 * -5 + sVar6 * 4 + *(short *)((long)d5 + lVar17);
        }
        t0[1] = w1[0];
        t0[0] = w0[0];
        t2[1] = w1[2];
        t2[0] = w0[2];
        t3[1] = w1[3];
        t3[0] = w0[3];
        t4[1] = w1[4];
        t4[0] = w0[4];
        t0[3] = w3[0];
        t0[2] = w2[0];
        t2[3] = w3[2];
        t2[2] = w2[2];
        t3[3] = w3[3];
        t3[2] = w2[3];
        t4[3] = w3[4];
        t4[2] = w2[4];
        t0[4] = (short)w4._0_4_;
        t0[5] = w5[0];
        t1[5] = w5[1];
        t1[4] = w4[1];
        t2[4] = (short)w4._4_4_;
        t2[5] = w5[2];
        t3[5] = w5[3];
        t3[4] = w4[3];
        t4[4] = (short)w4._8_4_;
        t4[5] = w5[4];
        t5[5] = w5[5];
        t5[4] = w4[5];
        for (lVar17 = 0; lVar17 != 0xc; lVar17 = lVar17 + 2) {
          sVar4 = *(short *)((long)t2 + lVar17);
          sVar5 = *(short *)((long)t4 + lVar17);
          *(short *)((long)&top_blob_bordered.data + lVar17) =
               sVar4 * -5 + *(short *)((long)t0 + lVar17) * 4 + sVar5;
          sVar6 = *(short *)((long)t1 + lVar17);
          sVar7 = *(short *)((long)t3 + lVar17);
          *(short *)((long)d3 + lVar17 + -0x40) = sVar5 + (sVar4 + sVar6) * -4 + sVar7;
          *(short *)((long)d2 + lVar17) = (sVar5 - sVar7) + (sVar6 - sVar4) * 4;
          *(short *)((long)d3 + lVar17) = (sVar5 - (sVar4 + sVar6 * 2)) + sVar7 * 2;
          *(short *)((long)d4 + lVar17) = (sVar5 + sVar6 * 2) - (sVar4 + sVar7 * 2);
          *(short *)((long)d5 + lVar17) = sVar7 * -5 + sVar6 * 4 + *(short *)((long)t5 + lVar17);
        }
        for (lVar17 = 0; lVar17 != 0xc; lVar17 = lVar17 + 2) {
          *(undefined2 *)((long)pvVar24 + lVar17) =
               *(undefined2 *)((long)&top_blob_bordered.data + lVar17);
          *(undefined2 *)((long)pvVar24 + lVar17 + 0xc) = *(undefined2 *)((long)d3 + lVar17 + -0x40)
          ;
          *(undefined2 *)((long)pvVar24 + lVar17 + 0x18) = *(undefined2 *)((long)d2 + lVar17);
          *(undefined2 *)((long)pvVar24 + lVar17 + 0x24) = *(undefined2 *)((long)d3 + lVar17);
          *(undefined2 *)((long)pvVar24 + lVar17 + 0x30) = *(undefined2 *)((long)d4 + lVar17);
          *(undefined2 *)((long)pvVar24 + lVar17 + 0x3c) = *(undefined2 *)((long)d5 + lVar17);
        }
        lVar12 = lVar12 + 4;
        pvVar24 = (void *)((long)pvVar24 + 0x48);
      }
    }
  }
  top_blob_bordered.elemsize._0_4_ = 0;
  top_blob_bordered.elemsize._4_4_ = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  Mat::operator=(&bottom_blob_bordered,&top_blob_bordered);
  Mat::~Mat(&top_blob_bordered);
  top_blob_tm.elemsize._0_4_ = 0;
  top_blob_tm.elemsize._4_4_ = 0;
  top_blob_tm.elempack = 0;
  top_blob_tm.data = (void *)0x0;
  top_blob_tm.refcount._0_4_ = 0;
  top_blob_tm.refcount._4_4_ = 0;
  top_blob_tm.allocator = (Allocator *)0x0;
  top_blob_tm.dims = 0;
  top_blob_tm.w = 0;
  top_blob_tm.h = 0;
  top_blob_tm.c = 0;
  top_blob_tm.cstep = 0;
  Mat::create(&top_blob_tm,0x24,_h,_c_00,4,opt->workspace_allocator);
  uVar27 = 0;
  uVar15 = (ulong)_h;
  if ((int)_h < 1) {
    uVar15 = uVar27;
  }
  uVar11 = 0;
  if (0 < (int)_c_00) {
    uVar11 = (ulong)_c_00;
  }
  for (; uVar27 != uVar11; uVar27 = uVar27 + 1) {
    iVar13 = top_blob_tm.w;
    lVar12 = CONCAT44(top_blob_tm.elemsize._4_4_,(undefined4)top_blob_tm.elemsize);
    d2._0_8_ = top_blob_tm.cstep * uVar27 * lVar12 + (long)top_blob_tm.data;
    stack0xfffffffffffffc68 = (int *)0x0;
    Mat::channel((Mat *)d3,kernel_tm,(int)uVar27);
    for (iVar22 = 0; uVar9 = d2._0_8_, iVar22 != (int)uVar15; iVar22 = iVar22 + 1) {
      memset(&top_blob_bordered,0,0x90);
      for (uVar28 = 0; pvVar16 = bottom_blob_tm.data, uVar28 != uVar30; uVar28 = uVar28 + 1) {
        iVar26 = bottom_blob_tm.w;
        lVar20 = bottom_blob_tm.cstep * uVar28;
        lVar17 = CONCAT44(bottom_blob_tm.elemsize._4_4_,(undefined4)bottom_blob_tm.elemsize);
        d4._0_8_ = lVar20 * lVar17 + (long)bottom_blob_tm.data;
        stack0xfffffffffffffec0 = (int *)0x0;
        Mat::~Mat((Mat *)d4);
        for (lVar19 = 0; lVar19 != 0x24; lVar19 = lVar19 + 1) {
          piVar3 = (int *)((long)&top_blob_bordered.data + lVar19 * 4);
          *piVar3 = *piVar3 + (int)*(short *)((long)(local_24c * (int)uVar28) * local_268 + d3._0_8_
                                             + lVar19 * 2) *
                              (int)*(short *)((long)pvVar16 +
                                             lVar19 * 2 + (iVar26 * iVar22 + lVar20) * lVar17);
        }
      }
      for (lVar17 = 0; lVar17 != 0x24; lVar17 = lVar17 + 1) {
        *(undefined4 *)(uVar9 + lVar12 * (iVar13 * iVar22) + lVar17 * 4) =
             *(undefined4 *)((long)&top_blob_bordered.data + lVar17 * 4);
      }
    }
    Mat::~Mat((Mat *)d3);
    Mat::~Mat((Mat *)d2);
  }
  top_blob_bordered.elemsize._0_4_ = 0;
  top_blob_bordered.elemsize._4_4_ = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  Mat::operator=(&bottom_blob_tm,&top_blob_bordered);
  Mat::~Mat(&top_blob_bordered);
  top_blob_bordered.elemsize._0_4_ = 0;
  top_blob_bordered.elemsize._4_4_ = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  Mat::create(&top_blob_bordered,_w,iVar18 * 4,_c_00,4,opt->workspace_allocator);
  uVar15 = 0;
  while( true ) {
    if (uVar15 == uVar11) break;
    d2._0_8_ = (void *)(top_blob_tm.cstep * uVar15 *
                        CONCAT44(top_blob_tm.elemsize._4_4_,(undefined4)top_blob_tm.elemsize) +
                       (long)top_blob_tm.data);
    stack0xfffffffffffffc68 = (int *)0x0;
    lVar12 = CONCAT44(top_blob_bordered.elemsize._4_4_,(undefined4)top_blob_bordered.elemsize);
    d3._0_8_ = top_blob_bordered.cstep * uVar15 * lVar12 + (long)top_blob_bordered.data;
    stack0xfffffffffffffd90 = (int *)0x0;
    iVar18 = 0;
    for (iVar13 = 0; uVar9 = d2._0_8_, local_2c0 = (int)uVar23, iVar13 != local_2c0;
        iVar13 = iVar13 + 1) {
      pvVar16 = (void *)((iVar13 * 4 * top_blob_bordered.w) * lVar12 + d3._0_8_);
      pvVar24 = (void *)(((iVar13 * 4 + 1) * top_blob_bordered.w) * lVar12 + d3._0_8_);
      pvVar21 = (void *)(((iVar13 * 4 + 2) * top_blob_bordered.w) * lVar12 + d3._0_8_);
      pvVar25 = (void *)(((iVar13 * 4 + 3) * top_blob_bordered.w) * lVar12 + d3._0_8_);
      iVar22 = iVar18;
      for (iVar26 = 0; iVar26 != iVar10; iVar26 = iVar26 + 1) {
        lVar17 = (long)(top_blob_tm.w * iVar22) *
                 CONCAT44(top_blob_tm.elemsize._4_4_,(undefined4)top_blob_tm.elemsize) + uVar9;
        for (lVar19 = 0; lVar19 != 0x18; lVar19 = lVar19 + 4) {
          *(undefined4 *)((long)d4 + lVar19) = *(undefined4 *)(lVar17 + lVar19);
          *(undefined4 *)((long)d5 + lVar19) = *(undefined4 *)(lVar17 + 0x18 + lVar19);
          *(undefined4 *)((long)w0 + lVar19) = *(undefined4 *)(lVar17 + 0x30 + lVar19);
          *(undefined4 *)((long)w1 + lVar19) = *(undefined4 *)(lVar17 + 0x48 + lVar19);
          *(undefined4 *)((long)w2 + lVar19) = *(undefined4 *)(lVar17 + 0x60 + lVar19);
          *(undefined4 *)((long)w3 + lVar19) = *(undefined4 *)(lVar17 + 0x78 + lVar19);
        }
        for (lVar17 = 0; lVar17 != 0x18; lVar17 = lVar17 + 4) {
          iVar1 = *(int *)((long)w0 + lVar17) + *(int *)((long)d5 + lVar17);
          iVar2 = *(int *)((long)w1 + lVar17) + *(int *)((long)w2 + lVar17);
          *(int *)((long)w4 + lVar17) = iVar1 + *(int *)((long)d4 + lVar17) + iVar2;
          iVar29 = *(int *)((long)w1 + lVar17) - *(int *)((long)w2 + lVar17);
          iVar14 = *(int *)((long)d5 + lVar17) - *(int *)((long)w0 + lVar17);
          *(int *)((long)w5 + lVar17) = iVar14 + iVar29 * 2;
          *(int *)((long)t0 + lVar17) = iVar1 + iVar2 * 4;
          *(int *)((long)t1 + lVar17) = iVar14 + iVar29 * 8 + *(int *)((long)w3 + lVar17);
        }
        t2[0] = w4[0];
        t2[1] = w4[1];
        t2[2] = w5[0];
        t2[3] = w5[1];
        t2[4] = t0[0];
        t2[5] = t0[1];
        t3[0] = w4[2];
        t3[1] = w4[3];
        t3[2] = w5[2];
        t3[3] = w5[3];
        t3[4] = t0[2];
        t3[5] = t0[3];
        t4[0] = w4[4];
        t4[1] = w4[5];
        t4[2] = w5[4];
        t4[3] = w5[5];
        t4[4] = t0[4];
        t4[5] = t0[5];
        t5._8_4_ = local_3ec._0_4_;
        for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 4) {
          iVar1 = *(int *)((long)t4 + lVar17) + *(int *)((long)t3 + lVar17);
          iVar2 = *(int *)((long)t5 + lVar17) + *(int *)((long)d4_1 + lVar17);
          *(int *)((long)o0 + lVar17) = iVar1 + *(int *)((long)t2 + lVar17) + iVar2;
          iVar29 = *(int *)((long)t5 + lVar17) - *(int *)((long)d4_1 + lVar17);
          iVar14 = *(int *)((long)t3 + lVar17) - *(int *)((long)t4 + lVar17);
          *(int *)((long)o1 + lVar17) = iVar14 + iVar29 * 2;
          *(int *)((long)o2 + lVar17) = iVar1 + iVar2 * 4;
          *(int *)((long)o3 + lVar17) = iVar14 + iVar29 * 8 + *(int *)((long)d5_1 + lVar17);
        }
        for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 4) {
          *(int *)((long)pvVar16 + lVar17) = *(int *)((long)o0 + lVar17) / 0x240;
          *(int *)((long)pvVar24 + lVar17) = *(int *)((long)o1 + lVar17) / 0x240;
          *(int *)((long)pvVar21 + lVar17) = *(int *)((long)o2 + lVar17) / 0x240;
          *(int *)((long)pvVar25 + lVar17) = *(int *)((long)o3 + lVar17) / 0x240;
        }
        pvVar16 = (void *)((long)pvVar16 + 0x10);
        pvVar24 = (void *)((long)pvVar24 + 0x10);
        pvVar21 = (void *)((long)pvVar21 + 0x10);
        pvVar25 = (void *)((long)pvVar25 + 0x10);
        iVar22 = iVar22 + 1;
      }
      iVar18 = iVar18 + iVar8;
    }
    Mat::~Mat((Mat *)d3);
    Mat::~Mat((Mat *)d2);
    uVar15 = uVar15 + 1;
  }
  copy_cut_border(&top_blob_bordered,top_blob,0,top_blob_bordered.h - top_blob->h,0,
                  top_blob_bordered.w - top_blob->w,opt);
  Mat::~Mat(&top_blob_bordered);
  Mat::~Mat(&top_blob_tm);
  Mat::~Mat(&bottom_blob_tm);
  Mat::~Mat(&bottom_blob_bordered);
  return;
}

Assistant:

static void conv3x3s1_winograd43_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 4n+2, winograd F(4,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 3) / 4 * 4;
    outh = (outh + 3) / 4 * 4;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(6*6, tiles, inch, 2u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {4.0f, 0.0f, -5.0f, 0.0f, 1.0f, 0.0f},
        //     {0.0f,-4.0f, -4.0f, 1.0f, 1.0f, 0.0f},
        //     {0.0f, 4.0f, -4.0f,-1.0f, 1.0f, 0.0f},
        //     {0.0f,-2.0f, -1.0f, 2.0f, 1.0f, 0.0f},
        //     {0.0f, 2.0f, -1.0f,-2.0f, 1.0f, 0.0f},
        //     {0.0f, 4.0f,  0.0f,-5.0f, 0.0f, 1.0f}
        // };

		// 0 =	4 * r00  - 5 * r02	+ r04
        // 1 = -4 * (r01 + r02)  + r03 + r04
        // 2 =	4 * (r01 - r02)  - r03 + r04
        // 3 = -2 * r01 - r02 + 2 * r03 + r04
        // 4 =	2 * r01 - r02 - 2 * r03 + r04
		// 5 =	4 * r01 - 5 * r03 + r05

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<inch; q++)
        {
            const signed char* img = bottom_blob_bordered.channel(q);
            short* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const signed char* r0 = img + w * j * 4;
                const signed char* r1 = r0 + w;
                const signed char* r2 = r1 + w;
                const signed char* r3 = r2 + w;
                const signed char* r4 = r3 + w;
                const signed char* r5 = r4 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    short d0[6],d1[6],d2[6],d3[6],d4[6],d5[6];
                    short w0[6],w1[6],w2[6],w3[6],w4[6],w5[6];
                    short t0[6],t1[6],t2[6],t3[6],t4[6],t5[6];

                    // load
                    for (int n = 0; n < 6; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                        d4[n] = r4[n];
                        d5[n] = r5[n];
                    }
                    // w = B_t * d
                    for (int n = 0; n < 6; n++)
                    {   
                        w0[n] =  4*d0[n]          - 5*d2[n]           + d4[n];
                        w1[n] =          -4*d1[n] - 4*d2[n] +   d3[n] + d4[n];
                        w2[n] =           4*d1[n] - 4*d2[n] -   d3[n] + d4[n];
                        w3[n] =          -2*d1[n] -   d2[n] + 2*d3[n] + d4[n];
                        w4[n] =           2*d1[n] -   d2[n] - 2*d3[n] + d4[n];
                        w5[n] =           4*d1[n]           - 5*d3[n]          + d5[n];
                    }
                    // transpose d to d_t
                    {
                        t0[0]=w0[0]; t1[0]=w0[1]; t2[0]=w0[2]; t3[0]=w0[3]; t4[0]=w0[4]; t5[0]=w0[5];
                        t0[1]=w1[0]; t1[1]=w1[1]; t2[1]=w1[2]; t3[1]=w1[3]; t4[1]=w1[4]; t5[1]=w1[5];
                        t0[2]=w2[0]; t1[2]=w2[1]; t2[2]=w2[2]; t3[2]=w2[3]; t4[2]=w2[4]; t5[2]=w2[5];
                        t0[3]=w3[0]; t1[3]=w3[1]; t2[3]=w3[2]; t3[3]=w3[3]; t4[3]=w3[4]; t5[3]=w3[5];
                        t0[4]=w4[0]; t1[4]=w4[1]; t2[4]=w4[2]; t3[4]=w4[3]; t4[4]=w4[4]; t5[4]=w4[5];
                        t0[5]=w5[0]; t1[5]=w5[1]; t2[5]=w5[2]; t3[5]=w5[3]; t4[5]=w5[4]; t5[5]=w5[5];
                    }                   
                    // d = B_t * d_t
                    for (int n = 0; n < 6; n++)
                    {   
                        d0[n] =  4*t0[n]           - 5*t2[n]           + t4[n];
                        d1[n] =          - 4*t1[n] - 4*t2[n] +   t3[n] + t4[n];
                        d2[n] =            4*t1[n] - 4*t2[n] -   t3[n] + t4[n];
                        d3[n] =          - 2*t1[n] -   t2[n] + 2*t3[n] + t4[n];
                        d4[n] =            2*t1[n] -   t2[n] - 2*t3[n] + t4[n];
                        d5[n] =            4*t1[n]           - 5*t3[n]          + t5[n];
                    }                   
                    // save to out_tm
                    for (int n = 0; n < 6; n++)
                    {
                        out_tm0[n   ] = d0[n];
                        out_tm0[n+ 6] = d1[n];
                        out_tm0[n+12] = d2[n];
                        out_tm0[n+18] = d3[n];
                        out_tm0[n+24] = d4[n];
                        out_tm0[n+30] = d5[n];
                    }

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    r3 += 4;
                    r4 += 4;
                    r5 += 4;

                    out_tm0 += 36;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        const int tiles = nColBlocks * nRowBlocks; 

        top_blob_tm.create(36, tiles, outch, 4u, opt.workspace_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i=0; i<tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);

                int sum0[36] = {0};

                for (int q=0; q<inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* k0 = kernel0_tm.row<short>(q);

                    for (int n=0; n<36; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                    }
                }

                for (int n=0; n<36; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[4][6] = {
        //     {1.0f, 1.0f,  1.0f, 1.0f,  1.0f, 0.0f},
        //     {0.0f, 1.0f, -1.0f, 2.0f, -2.0f, 0.0f},
        //     {0.0f, 1.0f,  1.0f, 4.0f,  4.0f, 0.0f},
        //     {0.0f, 1.0f, -1.0f, 8.0f, -8.0f, 1.0f}
        // };

        // 0 =	r00 + r01 + r02 + r03 +	r04
        // 1 =		  r01 - r02 + 2 * (r03 - r04)
        // 2 =		  r01 + r02 + 4 * (r03 + r04)
        // 3 =		  r01 - r02 + 8 * (r03 - r04)  + r05
        

        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            for (int j=0; j<nColBlocks; j++)
            {
                int* outRow0 = out.row<int>(j*4);
                int* outRow1 = out.row<int>(j*4+1);
                int* outRow2 = out.row<int>(j*4+2);
                int* outRow3 = out.row<int>(j*4+3);                

                for(int i=0; i<nRowBlocks; i++)
                {
                    int* out_tile = out_tm.row<int>(j*nRowBlocks + i);

                    int s0[6],s1[6],s2[6],s3[6],s4[6],s5[6];
                    int w0[6],w1[6],w2[6],w3[6];
                    int d0[4],d1[4],d2[4],d3[4],d4[4],d5[4];
                    int o0[4],o1[4],o2[4],o3[4];
                    // load
                    for (int n = 0; n < 6; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n+ 6];
                        s2[n] = out_tile[n+12];
                        s3[n] = out_tile[n+18];
                        s4[n] = out_tile[n+24];
                        s5[n] = out_tile[n+30];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 6; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n] +   s3[n] +   s4[n];
                        w1[n] =         s1[n] - s2[n] + 2*s3[n] - 2*s4[n];
                        w2[n] =         s1[n] + s2[n] + 4*s3[n] + 4*s4[n];
                        w3[n] =         s1[n] - s2[n] + 8*s3[n] - 8*s4[n] + s5[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0]; d0[1] = w1[0]; d0[2] = w2[0]; d0[3] = w3[0];
                        d1[0] = w0[1]; d1[1] = w1[1]; d1[2] = w2[1]; d1[3] = w3[1];
                        d2[0] = w0[2]; d2[1] = w1[2]; d2[2] = w2[2]; d2[3] = w3[2];
                        d3[0] = w0[3]; d3[1] = w1[3]; d3[2] = w2[3]; d3[3] = w3[3];
                        d4[0] = w0[4]; d4[1] = w1[4]; d4[2] = w2[4]; d4[3] = w3[4];
                        d5[0] = w0[5]; d5[1] = w1[5]; d5[2] = w2[5]; d5[3] = w3[5];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 4; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n] +   d3[n] +   d4[n];
                        o1[n] =         d1[n] - d2[n] + 2*d3[n] - 2*d4[n];
                        o2[n] =         d1[n] + d2[n] + 4*d3[n] + 4*d4[n];
                        o3[n] =         d1[n] - d2[n] + 8*d3[n] - 8*d4[n] + d5[n];
                    }
                    // save to top blob tm
                    for (int n = 0; n < 4; n++)
                    {
                        outRow0[n] = o0[n] / 576;
                        outRow1[n] = o1[n] / 576;
                        outRow2[n] = o2[n] / 576;
                        outRow3[n] = o3[n] / 576;
                    }

                    outRow0 += 4;
                    outRow1 += 4;
                    outRow2 += 4;
                    outRow3 += 4;
                }
            }
        }
    }
    // END transform output 

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}